

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O0

void __thiscall
correctness_sub_signed_Test::~correctness_sub_signed_Test(correctness_sub_signed_Test *this)

{
  void *in_RDI;
  
  ~correctness_sub_signed_Test((correctness_sub_signed_Test *)0x127518);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(correctness, sub_signed)
{
    big_integer a = 5;
    big_integer b = 20;

    EXPECT_TRUE(a - b == -15);

    a -= b;
    EXPECT_TRUE(a == -15);

    a -= -100;
    EXPECT_TRUE(a == 85);
}